

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O0

void __thiscall Code_generator::visit(Code_generator *this,Inst_load_store_indirect *s)

{
  Register *pRVar1;
  Expression *pEVar2;
  uint uVar3;
  allocator local_109;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  allocator local_81;
  string local_80;
  ushort local_5a;
  Value_type local_58;
  uint uStack_54;
  uint16_t constant_value;
  Value_type constant_type;
  uint code;
  uint byte;
  allocator local_39;
  string local_38;
  Inst_load_store_indirect *local_18;
  Inst_load_store_indirect *s_local;
  Code_generator *this_local;
  
  local_18 = s;
  s_local = (Inst_load_store_indirect *)this;
  ast::Instruction::check_alignment((Instruction *)s);
  if (7 < local_18->rn->n) {
    pRVar1 = local_18->rn;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Invalid register",&local_39);
    error_report(&pRVar1->location,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  constant_type = local_18->ldst & LABEL;
  uVar3 = 0;
  if ((local_18->ldst & 2) != 0) {
    uVar3 = 0x2000;
  }
  uStack_54 = uVar3 | constant_type << 0xb | local_18->rd->n | local_18->rn->n << 4;
  if (local_18->constant == (Expression *)0x0) {
    uStack_54 = local_18->rm->n * 0x80 + 0x1000 | uStack_54;
  }
  else {
    uVar3 = (*local_18->constant->_vptr_Expression[3])();
    if ((uVar3 & 1) != 0) {
      local_58 = ast::Expression::get_type(local_18->constant);
      if (local_58 == ABSOLUTE) {
        local_5a = ast::Expression::get_value(local_18->constant);
        if ((int)(uint)local_5a < 0) {
          pEVar2 = local_18->constant;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_80,"Expression\'s value must a positive number",&local_81);
          error_report(&pEVar2->location,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::allocator<char>::~allocator((allocator<char> *)&local_81);
        }
        else if (constant_type == ABSOLUTE) {
          if (((ulong)local_5a / 2 & 0xfffffff8) != 0) {
            pEVar2 = local_18->constant;
            uVar3 = local_5a & 7;
            string_printf_abi_cxx11_
                      (&local_c8,
                       "Expression\'s value / 2 = %d (0x%x) not encodable in %d bit,truncate to %d (0x%x)"
                       ,(ulong)(uint)local_5a,(ulong)local_5a,3,(ulong)uVar3,uVar3);
            warning_report(&pEVar2->location,&local_c8);
            std::__cxx11::string::~string((string *)&local_c8);
          }
          if ((local_5a & 1) != 0) {
            pEVar2 = local_18->constant;
            string_printf_abi_cxx11_
                      (&local_e8,"Expression\'s value = %d (0x%x) must be an even value",
                       (ulong)local_5a);
            warning_report(&pEVar2->location,&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
          }
          local_5a = local_5a / 2;
          uStack_54 = (local_5a & 7) << 7 | uStack_54;
        }
        else {
          if ((local_5a & 0xfff8) != 0) {
            pEVar2 = local_18->constant;
            uVar3 = local_5a & 7;
            string_printf_abi_cxx11_
                      (&local_a8,
                       "Expression\'s value = %d (0x%x) not encodable in %d bit, truncate to %d (0x%x)"
                       ,(ulong)(uint)local_5a,(ulong)local_5a,3,(ulong)uVar3,uVar3);
            warning_report(&pEVar2->location,&local_a8);
            std::__cxx11::string::~string((string *)&local_a8);
          }
          uStack_54 = (local_5a & 7) << 7 | uStack_54;
        }
      }
      else if (local_58 == LABEL) {
        pEVar2 = local_18->constant;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_108,"Can\'t be a label, must be a constant",&local_109);
        error_report(&pEVar2->location,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
      }
    }
  }
  ast::Sections::write16
            (*(uint *)&local_18->field_0x40,*(uint *)&local_18->field_0x44,(uint16_t)uStack_54);
  return;
}

Assistant:

void Code_generator::visit(Inst_load_store_indirect *s)
{
	s->check_alignment();
	if (s->rn->n > 7)
		error_report(&s->rn->location, "Invalid register");
	auto byte = s->ldst & 1;
	auto code = ((s->ldst & 2) ? STR_INDIRECT_OPCODE : LDR_INDIRECT_OPCODE)
			| (byte << LDR_STR_INDIRECT_BYTE_INDICATION_POSITION)
			| (s->rd->n << RD_POSITION) | (s->rn->n << RN_POSITION);
	if (s->constant == nullptr) {
		code |= (1 << LDR_STR_INDIRECT_REG_INDICATION_POSITION) + (s->rm->n << RM_POSITION);
	} else if (s->constant->evaluate()) {
		auto constant_type = s->constant->get_type();
		if (constant_type == ABSOLUTE) {
			auto constant_value = s->constant->get_value();
			if (constant_value < 0) {
				error_report(&s->constant->location,"Expression's value must a positive number");
			}
			else {
				if (byte) {
					if ((constant_value & ~MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0)) != 0) {
						warning_report(&s->constant->location,
							string_printf("Expression's value = %d (0x%x) not encodable in %d bit,"
									" truncate to %d (0x%x)",
							constant_value, constant_value, LDR_STR_INDIRECT_CONST_INDEX_SIZE,
							constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0),
							constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0)));
					}
					code |= ((constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0))
										<< LDR_STR_INDIRECT_CONST_INDEX_POSITION);
				}
				else {
					if (((constant_value / 2) & ~MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0)) != 0) {
						warning_report(&s->constant->location,
							string_printf( "Expression's value / 2 = %d (0x%x) not encodable in %d bit,"
									"truncate to %d (0x%x)",
							constant_value, constant_value, LDR_STR_INDIRECT_CONST_INDEX_SIZE,
							constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0),
							constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0)));
					}
					if ((constant_value & 1) != 0)
						warning_report(&s->constant->location, string_printf(
							"Expression's value = %d (0x%x) must be an even value", constant_value, constant_value));
					constant_value /= 2;
					code |= ((constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0))
										<< LDR_STR_INDIRECT_CONST_INDEX_POSITION);
				}
			}
		}
		else if (constant_type == Value_type::LABEL)
			error_report(&s->constant->location,"Can't be a label, must be a constant");
	}
	Sections::write16(s->section_index, s->section_offset, static_cast<uint16_t>(code));
}